

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::PastFunc::bindArgument
          (PastFunc *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,Args *param_5
          )

{
  int iVar1;
  undefined4 extraout_var;
  int in_ECX;
  sockaddr *in_RDX;
  long in_RSI;
  bitmask<slang::ast::ASTFlags> extraFlags;
  bitmask<slang::ast::ASTFlags> local_40;
  bitmask<slang::ast::ASTFlags> local_38;
  bitmask<slang::ast::ASTFlags> local_30 [2];
  int local_20;
  sockaddr *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = in_ECX;
  bitmask<slang::ast::ASTFlags>::bitmask(local_30,None);
  if ((local_10 == 0) || (local_10 == 2)) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_38,AssertionExpr);
    local_30[0].m_bits = local_38.m_bits;
  }
  if (local_10 == 2) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_40,NonProcedural);
    bitmask<slang::ast::ASTFlags>::operator|=(local_30,&local_40);
  }
  iVar1 = Expression::bind(local_20,local_18,(socklen_t)local_30[0].m_bits);
  return (Expression *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args&) const final {
        bitmask<ASTFlags> extraFlags = ASTFlags::None;
        if (argIndex == 0 || argIndex == 2)
            extraFlags = ASTFlags::AssertionExpr;

        if (argIndex == 2)
            extraFlags |= ASTFlags::NonProcedural;

        return Expression::bind(syntax, context, extraFlags);
    }